

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void do_check_fvn(uint tok_idx,uint line,char *file)

{
  uint uVar1;
  char *fmt;
  
  if (tokens[tok_idx].tp != SH4ASM_TOK_FVN) {
    sh4asm_error("%s - sanity check failed: \"%s\" (line %d of %s)\n","do_check_fvn",
                 "(tokens[tok_idx].tp == SH4ASM_TOK_FVN)",0x6b,
                 "/workspace/llm4binary/github/license_c_cmakelists/washingtondc-emu[P]sh4asm/sh4asm_core/parser.c"
                );
  }
  uVar1 = tokens[tok_idx].val.as_int;
  if (uVar1 < 0x10) {
    if ((uVar1 & 3) == 0) {
      return;
    }
    fmt = "invalid non-even double-precision floating-point register index %u (see line %d of %s)";
  }
  else {
    fmt = 
    "invalid out-of-range double-precision floating-point register index %u (see line %d of %s)";
  }
  sh4asm_error(fmt,(ulong)uVar1,line,
               "/workspace/llm4binary/github/license_c_cmakelists/washingtondc-emu[P]sh4asm/sh4asm_core/parser.c"
              );
}

Assistant:

static void do_check_fvn(unsigned tok_idx, unsigned line, char const *file) {
    CHECK(tokens[tok_idx].tp == SH4ASM_TOK_FVN);
    unsigned reg_idx = tokens[tok_idx].val.reg_idx;
    if (reg_idx >= 16)
        sh4asm_error("invalid out-of-range double-precision floating-point register "
             "index %u (see line %d of %s)", reg_idx, line, file);
    if (reg_idx & 3)
        sh4asm_error("invalid non-even double-precision floating-point register "
             "index %u (see line %d of %s)", reg_idx, line, file);
}